

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-passwd.c
# Opt level: O0

int run_test_get_passwd(void)

{
  int iVar1;
  size_t sVar2;
  int r;
  size_t len;
  uv_passwd_t pwd;
  
  iVar1 = uv_os_get_passwd(&len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
            ,0x21,"r == 0");
    abort();
  }
  sVar2 = strlen((char *)len);
  if (sVar2 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
            ,0x23,"len > 0");
    abort();
  }
  sVar2 = strlen((char *)pwd.gid);
  if (sVar2 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
            ,0x29,"len > 0");
    abort();
  }
  sVar2 = strlen(pwd.shell);
  if (sVar2 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
            ,0x2d,"len > 0");
    abort();
  }
  if (sVar2 == 1) {
    if (*pwd.shell != '/') {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
              ,0x36,"pwd.homedir[0] == \'/\'");
      abort();
    }
  }
  else if (pwd.shell[sVar2 - 1] == '/') {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
            ,0x38,"pwd.homedir[len - 1] != \'/\'");
    abort();
  }
  if ((long)pwd.username < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
            ,0x3f,"pwd.uid >= 0");
    abort();
  }
  if (pwd.uid < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
            ,0x40,"pwd.gid >= 0");
    abort();
  }
  uv_os_free_passwd(&len);
  if (len == 0) {
    if (pwd.gid != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
              ,0x47,"pwd.shell == NULL");
      abort();
    }
    if (pwd.shell != (char *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
              ,0x48,"pwd.homedir == NULL");
      abort();
    }
    uv_os_free_passwd(&len);
    if (len != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
              ,0x4d,"pwd.username == NULL");
      abort();
    }
    if (pwd.gid == 0) {
      if (pwd.shell != (char *)0x0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
                ,0x4f,"pwd.homedir == NULL");
        abort();
      }
      iVar1 = uv_os_get_passwd(0);
      if (iVar1 == -0x16) {
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
              ,0x53,"r == UV_EINVAL");
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
            ,0x4e,"pwd.shell == NULL");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
          ,0x46,"pwd.username == NULL");
  abort();
}

Assistant:

TEST_IMPL(get_passwd) {
  uv_passwd_t pwd;
  size_t len;
  int r;

  /* Test the normal case */
  r = uv_os_get_passwd(&pwd);
  ASSERT(r == 0);
  len = strlen(pwd.username);
  ASSERT(len > 0);

#ifdef _WIN32
  ASSERT(pwd.shell == NULL);
#else
  len = strlen(pwd.shell);
  ASSERT(len > 0);
#endif

  len = strlen(pwd.homedir);
  ASSERT(len > 0);

#ifdef _WIN32
  if (len == 3 && pwd.homedir[1] == ':')
    ASSERT(pwd.homedir[2] == '\\');
  else
    ASSERT(pwd.homedir[len - 1] != '\\');
#else
  if (len == 1)
    ASSERT(pwd.homedir[0] == '/');
  else
    ASSERT(pwd.homedir[len - 1] != '/');
#endif

#ifdef _WIN32
  ASSERT(pwd.uid == -1);
  ASSERT(pwd.gid == -1);
#else
  ASSERT(pwd.uid >= 0);
  ASSERT(pwd.gid >= 0);
#endif

  /* Test uv_os_free_passwd() */
  uv_os_free_passwd(&pwd);

  ASSERT(pwd.username == NULL);
  ASSERT(pwd.shell == NULL);
  ASSERT(pwd.homedir == NULL);

  /* Test a double free */
  uv_os_free_passwd(&pwd);

  ASSERT(pwd.username == NULL);
  ASSERT(pwd.shell == NULL);
  ASSERT(pwd.homedir == NULL);

  /* Test invalid input */
  r = uv_os_get_passwd(NULL);
  ASSERT(r == UV_EINVAL);

  return 0;
}